

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

Operator *
Operator::unary(Operator *__return_storage_ptr__,OperatorChar op,int precedence,
               OperatorAssociativity associativity,UnaryOperatorFn *applyFn)

{
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  function<ResultValue_(ResultValue)> local_40;
  
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  std::function<ResultValue_(ResultValue)>::function(&local_40,applyFn);
  Operator(__return_storage_ptr__,op,precedence,associativity,true,(BinaryOperatorFn *)&local_68,
           &local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Operator Operator::unary(OperatorChar op, int precedence, OperatorAssociativity associativity, UnaryOperatorFn applyFn) {
	return Operator(op, precedence, associativity, true, {}, applyFn);
}